

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O2

QBitArray * __thiscall QBitArray::operator&=(QBitArray *this,QBitArray *other)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d.d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
    performBitwiseOperationInCopy<std::bit_and<unsigned_char>>(this);
  }
  else {
    performBitwiseOperationInPlace<std::bit_and<unsigned_char>>(this);
  }
  return this;
}

Assistant:

QBitArray &QBitArray::operator&=(const QBitArray &other)
{
    return performBitwiseOperation(*this, other, std::bit_and<uchar>());
}